

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

bool dgrminer::operator<(labeled_edge_with_occurrences *lhs,labeled_edge_with_occurrences *rhs)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    uVar3 = uVar4;
    uVar4 = uVar3;
    if (uVar3 == 7) goto LAB_0012639c;
    iVar1 = (lhs->elements)._M_elems[uVar3];
    iVar2 = (rhs->elements)._M_elems[uVar3];
    if (iVar1 < iVar2) {
      uVar4 = 1;
      goto LAB_0012639c;
    }
    uVar4 = uVar3 + 1;
  } while (iVar1 <= iVar2);
  uVar4 = 0;
LAB_0012639c:
  return (bool)(uVar3 < 7 & (byte)uVar4);
}

Assistant:

inline bool operator<(const labeled_edge_with_occurrences& lhs, const labeled_edge_with_occurrences& rhs)
	{
		// look at the first 7 elements only (dont take the 8th one - the ID of the edge)
		for (int i = 0; i < 7; i++) {
			if (lhs.elements[i] < rhs.elements[i])
			{
				return true;
			}
			else if (lhs.elements[i] > rhs.elements[i])
			{
				return false;
			}
		}
		return false;
	}